

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerAcquireMapPage(Pager *pPager,Pgno pgno,void *pData,PgHdr **ppPage)

{
  void *pvVar1;
  long *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  PgHdr *p;
  i64 in_stack_ffffffffffffffc8;
  u64 in_stack_ffffffffffffffd0;
  
  if (*(long *)(in_RDI + 0xa8) == 0) {
    pvVar1 = sqlite3MallocZero(in_stack_ffffffffffffffd0);
    *in_RCX = (long)pvVar1;
    if (pvVar1 == (void *)0x0) {
      sqlite3OsUnfetch((sqlite3_file *)0x0,in_stack_ffffffffffffffc8,(void *)0x134601);
      return 7;
    }
    *(long *)((long)pvVar1 + 0x10) = (long)pvVar1 + 0x48;
    *(undefined2 *)((long)pvVar1 + 0x2c) = 0x40;
    *(undefined2 *)((long)pvVar1 + 0x2e) = 1;
    *(long *)((long)pvVar1 + 0x20) = in_RDI;
  }
  else {
    pvVar1 = *(void **)(in_RDI + 0xa8);
    *in_RCX = (long)pvVar1;
    *(undefined8 *)(in_RDI + 0xa8) = *(undefined8 *)((long)pvVar1 + 0x18);
    *(undefined8 *)((long)pvVar1 + 0x18) = 0;
    memset(*(void **)((long)pvVar1 + 0x10),0,(ulong)*(ushort *)(in_RDI + 0xb0));
  }
  *(undefined4 *)((long)pvVar1 + 0x28) = in_ESI;
  *(undefined8 *)((long)pvVar1 + 8) = in_RDX;
  *(int *)(in_RDI + 0x98) = *(int *)(in_RDI + 0x98) + 1;
  return 0;
}

Assistant:

static int pagerAcquireMapPage(
  Pager *pPager,                  /* Pager object */
  Pgno pgno,                      /* Page number */
  void *pData,                    /* xFetch()'d data for this page */
  PgHdr **ppPage                  /* OUT: Acquired page object */
){
  PgHdr *p;                       /* Memory mapped page to return */
  
  if( pPager->pMmapFreelist ){
    *ppPage = p = pPager->pMmapFreelist;
    pPager->pMmapFreelist = p->pDirty;
    p->pDirty = 0;
    memset(p->pExtra, 0, pPager->nExtra);
  }else{
    *ppPage = p = (PgHdr *)sqlite3MallocZero(sizeof(PgHdr) + pPager->nExtra);
    if( p==0 ){
      sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1) * pPager->pageSize, pData);
      return SQLITE_NOMEM;
    }
    p->pExtra = (void *)&p[1];
    p->flags = PGHDR_MMAP;
    p->nRef = 1;
    p->pPager = pPager;
  }

  assert( p->pExtra==(void *)&p[1] );
  assert( p->pPage==0 );
  assert( p->flags==PGHDR_MMAP );
  assert( p->pPager==pPager );
  assert( p->nRef==1 );

  p->pgno = pgno;
  p->pData = pData;
  pPager->nMmapOut++;

  return SQLITE_OK;
}